

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::reducev
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined4 in_ECX;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  PtexHalf *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  int dstride_00;
  undefined4 in_stack_ffffffffffffffe8;
  int uw_00;
  int sstride_00;
  
  dstride_00 = (int)((ulong)in_R8 >> 0x20);
  uw_00 = (int)in_RDI;
  sstride_00 = (int)((ulong)in_RDI >> 0x20);
  switch(in_stack_00000008) {
  case 0:
    anon_unknown_1::reducev<unsigned_char>
              ((uchar *)unaff_retaddr,sstride_00,uw_00,in_ESI,
               (uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),dstride_00,in_stack_00000010);
    break;
  case 1:
    anon_unknown_1::reducev<unsigned_short>
              (&unaff_retaddr->bits,sstride_00,uw_00,in_ESI,
               (unsigned_short *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),dstride_00,
               in_stack_00000010);
    break;
  case 2:
    anon_unknown_1::reducev<Ptex::v2_2::PtexHalf>
              (unaff_retaddr,sstride_00,uw_00,in_ESI,
               (PtexHalf *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),dstride_00,in_stack_00000010);
    break;
  case 3:
    anon_unknown_1::reducev<float>
              ((float *)unaff_retaddr,sstride_00,uw_00,in_ESI,
               (float *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),dstride_00,in_stack_00000010);
  }
  return;
}

Assistant:

void reducev(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reducev(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reducev(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reducev(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reducev(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}